

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O1

base_learner * oaa_setup(options_i *options,vw *all)

{
  uint64_t *initial;
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  uint32_t uVar3;
  namedlabels *pnVar4;
  uint32_t *puVar5;
  parser *ppVar6;
  vw *pvVar7;
  options_i *options_00;
  int iVar8;
  oaa *dat;
  option_group_definition *poVar9;
  polyprediction *ppVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  base_learner *l;
  single_learner *base;
  learner<oaa,_example> *plVar14;
  ostream *poVar15;
  vw_exception *this;
  long lVar16;
  undefined **ppuVar17;
  label_parser *plVar18;
  long lVar19;
  byte bVar20;
  float fVar21;
  bool scores;
  bool probabilities;
  size_type __dnew_4;
  option_group_definition new_options;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew_1;
  size_type __dnew;
  bool local_532;
  bool local_531;
  vw *local_530;
  uint64_t *local_528;
  _func_int ***local_520;
  _func_int **local_518;
  _func_int **local_510 [2];
  options_i *local_500;
  long local_4f8;
  _func_int ***local_4f0;
  _func_int **local_4e8;
  _func_int **local_4e0 [2];
  _func_int ***local_4d0;
  _func_int **local_4c8;
  _func_int **local_4c0 [2];
  string local_4b0;
  string local_490;
  option_group_definition local_470;
  long *local_438;
  long local_430;
  long local_428 [2];
  _func_int ***local_418;
  _func_int **local_410;
  _func_int **local_408 [2];
  string local_3f8;
  string local_3d8;
  string local_3b8;
  undefined1 local_398 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_310;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_300;
  undefined1 local_2f8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  undefined1 local_258 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  undefined1 local_1b8 [48];
  string local_188 [64];
  bool local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  
  bVar20 = 0;
  dat = calloc_or_throw<oaa>(1);
  dat->k = 0;
  dat->all = (vw *)0x0;
  dat->pred = (polyprediction *)0x0;
  dat->num_subsample = 0;
  dat->subsample_order = (uint32_t *)0x0;
  dat->subsample_id = 0;
  local_531 = false;
  local_532 = false;
  local_1b8._0_8_ = (_func_int **)0x17;
  local_520 = local_510;
  local_520 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_520,(ulong)local_1b8);
  local_510[0] = (_func_int **)local_1b8._0_8_;
  *(undefined4 *)local_520 = 0x20656e4f;
  builtin_strncpy((char *)((long)local_520 + 4),"Agai",4);
  *(undefined4 *)(local_520 + 1) = 0x2074736e;
  builtin_strncpy((char *)((long)local_520 + 0xc),"All ",4);
  builtin_strncpy((char *)((long)local_520 + 0xf)," Options",8);
  local_518 = (_func_int **)local_1b8._0_8_;
  *(char *)((long)local_520 + local_1b8._0_8_) = '\0';
  local_470.m_name._M_dataplus._M_p = (pointer)&local_470.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_470,local_520,(char *)(local_1b8._0_8_ + (long)local_520));
  local_470.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_470.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_470.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_520 != local_510) {
    operator_delete(local_520);
  }
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  local_490.field_2._M_allocated_capacity._0_4_ = 0x61616f;
  local_490._M_string_length = 3;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_1b8,&local_490,&dat->k);
  local_148 = true;
  local_4d0 = local_4c0;
  local_258._0_8_ = (_func_int **)0x2a;
  local_4d0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_4d0,(ulong)local_258);
  local_4c0[0] = (_func_int **)local_258._0_8_;
  builtin_strncpy((char *)((long)local_4d0 + 0x1a)," with <k",8);
  builtin_strncpy((char *)((long)local_4d0 + 0x22),"> labels",8);
  local_4d0[2] = (_func_int **)0x616c6369746c756d;
  local_4d0[3] = (_func_int **)0x2068746977207373;
  *local_4d0 = (_func_int **)0x696167612d656e4f;
  local_4d0[1] = (_func_int **)0x206c6c612d74736e;
  local_4c8 = (_func_int **)local_258._0_8_;
  *(char *)((long)local_4d0 + local_258._0_8_) = '\0';
  std::__cxx11::string::_M_assign(local_188);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (&local_470,(typed_option<unsigned_long> *)local_1b8);
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  local_4b0.field_2._M_allocated_capacity._0_5_ = 0x735f61616f;
  local_4b0.field_2._M_allocated_capacity._5_3_ = 0x736275;
  local_4b0.field_2._8_5_ = 0x656c706d61;
  local_4b0._M_string_length = 0xd;
  local_4b0.field_2._M_local_buf[0xd] = '\0';
  local_528 = &dat->num_subsample;
  local_500 = options;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_258,&local_4b0,local_528);
  local_4f0 = local_4e0;
  local_2f8._0_8_ = (_func_int **)0x38;
  local_4f0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_4f0,(ulong)local_2f8);
  local_4e0[0] = (_func_int **)local_2f8._0_8_;
  local_4f0[4] = (_func_int **)0x6c706d6178652065;
  local_4f0[5] = (_func_int **)0x206e656877207365;
  local_4f0[2] = (_func_int **)0x666f207265626d75;
  local_4f0[3] = (_func_int **)0x7669746167656e20;
  *local_4f0 = (_func_int **)0x6c706d6173627573;
  local_4f0[1] = (_func_int **)0x6e20736968742065;
  local_4f0[6] = (_func_int **)0x676e696e7261656c;
  local_4e8 = (_func_int **)local_2f8._0_8_;
  *(char *)((long)local_4f0 + local_2f8._0_8_) = '\0';
  local_530 = all;
  std::__cxx11::string::_M_assign((string *)(local_258 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar9,(typed_option<unsigned_long> *)local_258);
  local_3d8.field_2._M_allocated_capacity._0_5_ = 0x61626f7270;
  local_3d8.field_2._M_allocated_capacity._5_3_ = 0x6c6962;
  local_3d8.field_2._8_5_ = 0x7365697469;
  local_3d8._M_string_length = 0xd;
  local_3d8.field_2._M_local_buf[0xd] = '\0';
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2f8,&local_3d8,&local_531);
  local_398._0_8_ = (_func_int **)0x23;
  local_418 = local_408;
  local_418 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)local_398);
  local_408[0] = (_func_int **)local_398._0_8_;
  local_418[2] = (_func_int **)0x20666f2073657469;
  local_418[3] = (_func_int **)0x73616c63206c6c61;
  *local_418 = (_func_int **)0x2074636964657270;
  local_418[1] = (_func_int **)0x6c696261626f7270;
  builtin_strncpy((char *)((long)local_418 + 0x1f),"sses",4);
  local_410 = (_func_int **)local_398._0_8_;
  *(char *)((long)local_418 + local_398._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2f8 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar9,(typed_option<bool> *)local_2f8);
  local_3f8.field_2._M_allocated_capacity._0_4_ = 0x726f6373;
  local_3f8.field_2._M_allocated_capacity._4_2_ = 0x7365;
  local_3f8._M_string_length = 6;
  local_3f8.field_2._M_local_buf[6] = '\0';
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_398,&local_3f8,&local_532);
  local_4f8 = 0x1b;
  local_438 = local_428;
  local_438 = (long *)std::__cxx11::string::_M_create((ulong *)&local_438,(ulong)&local_4f8);
  local_428[0] = local_4f8;
  builtin_strncpy((char *)((long)local_438 + 0xb),"scores p",8);
  builtin_strncpy((char *)((long)local_438 + 0x13),"er class",8);
  *local_438 = 0x722074757074756f;
  local_438[1] = 0x65726f6373207761;
  local_430 = local_4f8;
  *(char *)((long)local_438 + local_4f8) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_398 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar9,(typed_option<bool> *)local_398);
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  local_398._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_300._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300._M_pi);
  }
  if (local_310._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_310._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  local_2f8._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260._M_pi);
  }
  if (local_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if (local_4f0 != local_4e0) {
    operator_delete(local_4f0);
  }
  options_00 = local_500;
  local_258._0_8_ = &PTR__typed_option_002d5088;
  if (local_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0._M_pi);
  }
  if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  if (local_4d0 != local_4c0) {
    operator_delete(local_4d0);
  }
  local_1b8._0_8_ = &PTR__typed_option_002d5088;
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
  }
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  (**options_00->_vptr_options_i)(options_00,&local_470);
  pp_Var2 = (_func_int **)(local_1b8 + 0x10);
  local_1b8._16_4_ = 0x61616f;
  local_1b8._8_8_ = (pointer)0x3;
  local_1b8._0_8_ = pp_Var2;
  iVar8 = (*options_00->_vptr_options_i[1])(options_00,local_1b8);
  if ((_func_int **)local_1b8._0_8_ != pp_Var2) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if ((char)iVar8 == '\0') {
    plVar14 = (learner<oaa,_example> *)0x0;
  }
  else {
    pnVar4 = local_530->sd->ldict;
    if ((pnVar4 != (namedlabels *)0x0) && (dat->k != (ulong)pnVar4->K)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"error: you have ",0x10);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15," named labels; use that as the argument to oaa",0x2e);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/oaa.cc"
                 ,0xdf,&local_3b8);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    dat->all = local_530;
    ppVar10 = calloc_or_throw<polyprediction>(dat->k);
    dat->pred = ppVar10;
    dat->subsample_order = (uint32_t *)0x0;
    dat->subsample_id = 0;
    if (dat->num_subsample != 0) {
      if (dat->num_subsample < dat->k) {
        puVar11 = calloc_or_throw<unsigned_int>(dat->k);
        dat->subsample_order = puVar11;
        if (dat->k != 0) {
          uVar12 = 0;
          do {
            dat->subsample_order[uVar12] = (uint32_t)uVar12;
            uVar12 = uVar12 + 1;
          } while (uVar12 < dat->k);
        }
        if (dat->k != 0) {
          initial = &local_530->random_state;
          lVar19 = 0;
          uVar12 = 0;
          do {
            fVar21 = merand48(initial);
            fVar21 = fVar21 * (float)(dat->k + lVar19);
            uVar13 = (ulong)fVar21;
            lVar16 = ((long)(fVar21 - 9.223372e+18) & (long)uVar13 >> 0x3f | uVar13) + uVar12;
            puVar5 = dat->subsample_order;
            uVar3 = puVar5[uVar12];
            puVar5[uVar12] = puVar5[lVar16];
            dat->subsample_order[lVar16] = uVar3;
            uVar12 = uVar12 + 1;
            lVar19 = lVar19 + -1;
          } while (uVar12 < dat->k);
        }
      }
      else {
        *local_528 = 0;
        pvVar1 = &local_530->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar1->super_ostream,
                   "oaa is turning off subsampling because your parameter >= K",0x3a);
        std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
        std::ostream::put((char)pvVar1);
        std::ostream::flush();
      }
    }
    pvVar7 = local_530;
    l = setup_base(options_00,local_530);
    base = LEARNER::as_singleline<char,char>(l);
    if (local_531 == false) {
      if (local_532 == true) {
        pvVar7->delete_prediction = delete_scalars;
        ppVar6 = pvVar7->p;
        plVar14 = LEARNER::learner<oaa,example>::init_learner<LEARNER::learner<char,example>>
                            (dat,base,predict_or_learn<true,false,true,false>,
                             predict_or_learn<false,false,true,false>,dat->k,scalars);
        *(undefined8 *)(plVar14 + 0x58) = *(undefined8 *)(plVar14 + 0x18);
        *(code **)(plVar14 + 0x68) = MULTICLASS::finish_example<oaa>;
        ppuVar17 = &MULTICLASS::mc_label;
        plVar18 = &ppVar6->lp;
        for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
          plVar18->default_label = (_func_void_void_ptr *)*ppuVar17;
          ppuVar17 = ppuVar17 + (ulong)bVar20 * -2 + 1;
          plVar18 = (label_parser *)((long)plVar18 + (ulong)bVar20 * -0x10 + 8);
        }
        *(undefined8 *)(plVar14 + 0x58) = *(undefined8 *)(plVar14 + 0x18);
        *(code **)(plVar14 + 0x68) = finish_example_scores<false>;
      }
      else {
        ppVar6 = pvVar7->p;
        if (pvVar7->raw_prediction < 1) {
          plVar14 = LEARNER::learner<oaa,example>::init_learner<LEARNER::learner<char,example>>
                              (dat,base,predict_or_learn<true,false,false,false>,
                               predict_or_learn<false,false,false,false>,dat->k,multiclass);
        }
        else {
          plVar14 = LEARNER::learner<oaa,example>::init_learner<LEARNER::learner<char,example>>
                              (dat,base,predict_or_learn<true,true,false,false>,
                               predict_or_learn<false,true,false,false>,dat->k,multiclass);
        }
        *(undefined8 *)(plVar14 + 0x58) = *(undefined8 *)(plVar14 + 0x18);
        *(code **)(plVar14 + 0x68) = MULTICLASS::finish_example<oaa>;
        ppuVar17 = &MULTICLASS::mc_label;
        plVar18 = &ppVar6->lp;
        for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
          plVar18->default_label = (_func_void_void_ptr *)*ppuVar17;
          ppuVar17 = ppuVar17 + (ulong)bVar20 * -2 + 1;
          plVar18 = (label_parser *)((long)plVar18 + (ulong)bVar20 * -0x10 + 8);
        }
      }
    }
    else {
      pvVar7->delete_prediction = delete_scalars;
      (**pvVar7->loss->_vptr_loss_function)(local_1b8);
      iVar8 = std::__cxx11::string::compare(local_1b8);
      if (iVar8 != 0) {
        pvVar1 = &pvVar7->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar1->super_ostream,
                   "WARNING: --probabilities should be used only with --loss_function=logistic",0x4a
                  );
        std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
        std::ostream::put((char)pvVar1);
        std::ostream::flush();
      }
      ppVar6 = pvVar7->p;
      plVar14 = LEARNER::learner<oaa,example>::init_learner<LEARNER::learner<char,example>>
                          (dat,base,predict_or_learn<true,false,true,true>,
                           predict_or_learn<false,false,true,true>,dat->k,scalars);
      *(undefined8 *)(plVar14 + 0x58) = *(undefined8 *)(plVar14 + 0x18);
      *(code **)(plVar14 + 0x68) = MULTICLASS::finish_example<oaa>;
      ppuVar17 = &MULTICLASS::mc_label;
      plVar18 = &ppVar6->lp;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        plVar18->default_label = (_func_void_void_ptr *)*ppuVar17;
        ppuVar17 = ppuVar17 + (ulong)bVar20 * -2 + 1;
        plVar18 = (label_parser *)((long)plVar18 + (ulong)bVar20 * -0x10 + 8);
      }
      pvVar7->sd->report_multiclass_log_loss = true;
      *(undefined8 *)(plVar14 + 0x58) = *(undefined8 *)(plVar14 + 0x18);
      *(code **)(plVar14 + 0x68) = finish_example_scores<true>;
      if ((_func_int **)local_1b8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1b8._0_8_);
      }
    }
    if (*local_528 != 0) {
      *(code **)(plVar14 + 0x28) = learn_randomized;
      *(undefined8 *)(plVar14 + 0x58) = *(undefined8 *)(plVar14 + 0x18);
      *(code **)(plVar14 + 0x68) = MULTICLASS::finish_example_without_loss<oaa>;
    }
    *(undefined8 *)(plVar14 + 0xb8) = *(undefined8 *)(plVar14 + 0x18);
    *(undefined8 *)(plVar14 + 0xc0) = *(undefined8 *)(plVar14 + 0x20);
    *(code **)(plVar14 + 200) = finish;
    dat = (oaa *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_470.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.m_name._M_dataplus._M_p != &local_470.m_name.field_2) {
    operator_delete(local_470.m_name._M_dataplus._M_p);
  }
  if (dat != (oaa *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar14;
}

Assistant:

LEARNER::base_learner* oaa_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<oaa>();
  bool probabilities = false;
  bool scores = false;
  option_group_definition new_options("One Against All Options");
  new_options.add(make_option("oaa", data->k).keep().help("One-against-all multiclass with <k> labels"))
      .add(make_option("oaa_subsample", data->num_subsample)
               .help("subsample this number of negative examples when learning"))
      .add(make_option("probabilities", probabilities).help("predict probabilites of all classes"))
      .add(make_option("scores", scores).help("output raw scores per class"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("oaa"))
    return nullptr;

  if (all.sd->ldict && (data->k != all.sd->ldict->getK()))
    THROW("error: you have " << all.sd->ldict->getK() << " named labels; use that as the argument to oaa")

  data->all = &all;
  data->pred = calloc_or_throw<polyprediction>(data->k);
  data->subsample_order = nullptr;
  data->subsample_id = 0;
  if (data->num_subsample > 0)
  {
    if (data->num_subsample >= data->k)
    {
      data->num_subsample = 0;
      all.trace_message << "oaa is turning off subsampling because your parameter >= K" << endl;
    }
    else
    {
      data->subsample_order = calloc_or_throw<uint32_t>(data->k);
      for (size_t i = 0; i < data->k; i++) data->subsample_order[i] = (uint32_t)i;
      for (size_t i = 0; i < data->k; i++)
      {
        size_t j = (size_t)(merand48(all.random_state) * (float)(data->k - i)) + i;
        uint32_t tmp = data->subsample_order[i];
        data->subsample_order[i] = data->subsample_order[j];
        data->subsample_order[j] = tmp;
      }
    }
  }

  oaa* data_ptr = data.get();
  LEARNER::learner<oaa, example>* l;
  auto base = as_singleline(setup_base(options, all));
  if (probabilities || scores)
  {
    all.delete_prediction = delete_scalars;
    if (probabilities)
    {
      auto loss_function_type = all.loss->getType();
      if (loss_function_type != "logistic")
        all.trace_message << "WARNING: --probabilities should be used only with --loss_function=logistic" << endl;
      // the three boolean template parameters are: is_learn, print_all and scores
      l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, true, true>,
          predict_or_learn<false, false, true, true>, all.p, data->k, prediction_type::scalars);
      all.sd->report_multiclass_log_loss = true;
      l->set_finish_example(finish_example_scores<true>);
    }
    else
    {
      l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, true, false>,
          predict_or_learn<false, false, true, false>, all.p, data->k, prediction_type::scalars);
      l->set_finish_example(finish_example_scores<false>);
    }
  }
  else if (all.raw_prediction > 0)
    l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, true, false, false>,
        predict_or_learn<false, true, false, false>, all.p, data->k, prediction_type::multiclass);
  else
    l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, false, false>,
        predict_or_learn<false, false, false, false>, all.p, data->k, prediction_type::multiclass);

  if (data_ptr->num_subsample > 0) {
    l->set_learn(learn_randomized);
    l->set_finish_example(MULTICLASS::finish_example_without_loss<oaa>);
  }
  l->set_finish(finish);

  return make_base(*l);
}